

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  iterator __position;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  pointer pMVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Layer *pLVar13;
  size_t sVar14;
  bool bVar15;
  pointer pBVar16;
  size_t *psVar17;
  long lVar18;
  int *piVar19;
  long lVar20;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  Mat shape_hints;
  char layer_type [256];
  char layer_name [256];
  ParamDict pd;
  bool local_cd5;
  int local_cd4;
  int local_cd0;
  int local_ccc;
  Mat local_cc8;
  ulong local_c88;
  int local_c80;
  int local_c7c;
  Layer *local_c78;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_c70;
  DataReader *local_c68;
  Net *local_c60;
  vector<int,_std::allocator<int>_> *local_c58;
  int local_c4c;
  vector<int,_std::allocator<int>_> *local_c48;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c40;
  Mat local_c38 [4];
  char local_b38 [256];
  char local_a38 [264];
  ParamDict local_930;
  
  local_c4c = 0;
  iVar10 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar10 == 1) {
    if (local_c4c == 0x7685dd) {
      local_c7c = 0;
      local_c80 = 0;
      iVar10 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar10 == 1) {
        iVar10 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_c80);
        if (iVar10 == 1) {
          if ((0 < (long)local_c7c) && (0 < local_c80)) {
            local_c40 = &this->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_c40,(long)local_c7c);
            local_c70 = &this->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(local_c70,(long)local_c80);
            ParamDict::ParamDict(&local_930);
            local_ccc = 0;
            local_cd5 = 0 < local_c7c;
            if (0 < local_c7c) {
              local_c88 = 0;
              local_c68 = dr;
              local_c60 = this;
              do {
                psVar17 = &local_c38[0].elemsize;
                local_cd0 = 0;
                local_cd4 = 0;
                iVar10 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_b38);
                if (iVar10 == 1) {
                  iVar10 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_a38);
                  if (iVar10 != 1) {
                    load_param();
                    goto LAB_0011d773;
                  }
                  iVar10 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_cd0);
                  if (iVar10 != 1) {
                    load_param();
                    goto LAB_0011d773;
                  }
                  iVar10 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_cd4);
                  if (iVar10 != 1) {
                    load_param();
                    goto LAB_0011d773;
                  }
                  pLVar13 = create_layer(local_b38);
                  if (pLVar13 == (Layer *)0x0) {
                    pLVar13 = create_custom_layer(local_c60,local_b38);
                  }
                  if (pLVar13 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %s not exists or registered\n",local_b38);
                    clear(local_c60);
                    uVar12 = 1;
                  }
                  else {
                    local_c78 = pLVar13;
                    local_c38[0].data = psVar17;
                    sVar14 = strlen(local_b38);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_c38,local_b38,local_b38 + sVar14);
                    std::__cxx11::string::operator=((string *)&local_c78->type,(string *)local_c38);
                    if ((size_t *)local_c38[0].data != psVar17) {
                      operator_delete(local_c38[0].data,
                                      CONCAT44(local_c38[0].elemsize._4_4_,
                                               (undefined4)local_c38[0].elemsize) + 1);
                    }
                    local_c38[0].data = psVar17;
                    sVar14 = strlen(local_a38);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_c38,local_a38,local_a38 + sVar14);
                    pLVar13 = local_c78;
                    std::__cxx11::string::operator=((string *)&local_c78->name,(string *)local_c38);
                    if ((size_t *)local_c38[0].data != psVar17) {
                      operator_delete(local_c38[0].data,
                                      CONCAT44(local_c38[0].elemsize._4_4_,
                                               (undefined4)local_c38[0].elemsize) + 1);
                    }
                    local_c48 = &pLVar13->bottoms;
                    std::vector<int,_std::allocator<int>_>::resize(local_c48,(long)local_cd0);
                    bVar15 = 0 < local_cd0;
                    uVar12 = 5;
                    dr = local_c68;
                    if (0 < local_cd0) {
                      lVar18 = 0;
                      do {
                        iVar10 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_c38);
                        if (iVar10 == 1) {
                          iVar11 = find_blob_index_by_name(local_c60,(char *)local_c38);
                          dr = local_c68;
                          if (iVar11 == -1) {
                            pBVar16 = (local_c70->
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                      _M_impl.super__Vector_impl_data._M_start;
                            local_cc8.data = &local_cc8.elemsize;
                            sVar14 = strlen((char *)local_c38);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_cc8,local_c38,
                                       (long)&local_c38[0].data + sVar14);
                            std::__cxx11::string::operator=
                                      ((string *)(pBVar16 + (int)local_c88),(string *)&local_cc8);
                            dr = local_c68;
                            if ((size_t *)local_cc8.data != &local_cc8.elemsize) {
                              operator_delete(local_cc8.data,
                                              CONCAT44(local_cc8.elemsize._4_4_,
                                                       (undefined4)local_cc8.elemsize) + 1);
                            }
                            iVar11 = (int)local_c88;
                            local_c88 = (ulong)(iVar11 + 1);
                          }
                          pBVar16 = (local_c70->
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                    _M_impl.super__Vector_impl_data._M_start;
                          __position._M_current =
                               pBVar16[iVar11].consumers.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              pBVar16[iVar11].consumers.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)&pBVar16[iVar11].consumers
                                       ,__position,&local_ccc);
                          }
                          else {
                            *__position._M_current = local_ccc;
                            pBVar16[iVar11].consumers.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                          }
                          (local_c48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar18] = iVar11;
                        }
                        else {
                          load_param();
                        }
                        if (iVar10 != 1) {
                          uVar12 = 1;
                          goto LAB_0011d56f;
                        }
                        lVar18 = lVar18 + 1;
                        bVar15 = lVar18 < local_cd0;
                      } while (lVar18 < local_cd0);
                      uVar12 = 5;
                    }
LAB_0011d56f:
                    if (!bVar15) {
                      local_c58 = &local_c78->tops;
                      std::vector<int,_std::allocator<int>_>::resize(local_c58,(long)local_cd4);
                      bVar15 = 0 < local_cd4;
                      uVar12 = 8;
                      if (0 < local_cd4) {
                        lVar18 = 0;
                        do {
                          pBVar16 = (local_c70->
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                    _M_impl.super__Vector_impl_data._M_start + (int)local_c88;
                          iVar10 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_c38);
                          if (iVar10 == 1) {
                            local_cc8.data = &local_cc8.elemsize;
                            sVar14 = strlen((char *)local_c38);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_cc8,local_c38,
                                       (long)&local_c38[0].data + sVar14);
                            std::__cxx11::string::operator=((string *)pBVar16,(string *)&local_cc8);
                            if ((size_t *)local_cc8.data != &local_cc8.elemsize) {
                              operator_delete(local_cc8.data,
                                              CONCAT44(local_cc8.elemsize._4_4_,
                                                       (undefined4)local_cc8.elemsize) + 1);
                            }
                            pBVar16->producer = local_ccc;
                            (local_c58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar18] = (int)local_c88;
                            local_c88 = (ulong)((int)local_c88 + 1);
                            dr = local_c68;
                          }
                          else {
                            load_param();
                          }
                          if (iVar10 != 1) {
                            uVar12 = 1;
                            goto LAB_0011d6d9;
                          }
                          lVar18 = lVar18 + 1;
                          bVar15 = lVar18 < local_cd4;
                        } while (lVar18 < local_cd4);
                        uVar12 = 8;
                      }
LAB_0011d6d9:
                      if (!bVar15) {
                        iVar10 = ParamDict::load_param(&local_930,dr);
                        if (iVar10 == 0) {
                          local_cc8.elemsize._0_4_ = 0;
                          local_cc8.elemsize._4_4_ = 0;
                          local_cc8.elempack = 0;
                          local_cc8.data = (void *)0x0;
                          local_cc8.refcount._0_4_ = 0;
                          local_cc8.refcount._4_4_ = 0;
                          local_cc8.h = 0;
                          local_cc8.c = 0;
                          local_cc8.cstep = 0;
                          local_cc8.allocator = (Allocator *)0x0;
                          local_cc8.dims = 0;
                          local_cc8.w = 0;
                          ParamDict::get(local_c38,&local_930,0x1e,&local_cc8);
                          piVar19 = (int *)CONCAT44(local_cc8.refcount._4_4_,
                                                    local_cc8.refcount._0_4_);
                          if (piVar19 != (int *)0x0) {
                            LOCK();
                            *piVar19 = *piVar19 + -1;
                            UNLOCK();
                            if (*piVar19 == 0) {
                              if (local_cc8.allocator == (Allocator *)0x0) {
                                if (local_cc8.data != (void *)0x0) {
                                  free(local_cc8.data);
                                }
                              }
                              else {
                                (**(code **)(*(long *)local_cc8.allocator + 0x18))();
                              }
                            }
                          }
                          if ((((size_t *)local_c38[0].data != (size_t *)0x0) &&
                              ((long)local_c38[0].c * local_c38[0].cstep != 0)) && (0 < local_cd4))
                          {
                            piVar19 = (int *)((long)local_c38[0].data + 8);
                            lVar18 = 0;
                            do {
                              iVar10 = (local_c58->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar18];
                              pBVar16 = (local_c70->
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)
                                        ._M_impl.super__Vector_impl_data._M_start;
                              iVar11 = (int)*(size_t *)(piVar19 + -2);
                              if (iVar11 == 3) {
LAB_0011daa9:
                                local_cc8.w = piVar19[-1];
                                local_cc8._48_8_ = *(undefined8 *)piVar19;
                                local_cc8.data = (void *)0x0;
                                local_cc8.refcount._0_4_ = 0;
                                local_cc8.refcount._4_4_ = 0;
                                local_cc8.elemsize._0_4_ = 4;
                                local_cc8.elemsize._4_4_ = 0;
                                local_cc8.elempack = 1;
                                local_cc8.allocator = (Allocator *)0x0;
                                local_cc8.dims = 3;
                                iVar11 = local_cc8.dims;
                                local_cc8.dims = 3;
                                local_cc8.cstep =
                                     (long)(local_cc8.h * local_cc8.w) + 3U & 0x3ffffffffffffffc;
                                if (&pBVar16[iVar10].shape != &local_cc8) {
                                  piVar3 = pBVar16[iVar10].shape.refcount;
                                  if (piVar3 != (int *)0x0) {
                                    LOCK();
                                    *piVar3 = *piVar3 + -1;
                                    UNLOCK();
                                    if (*piVar3 == 0) {
                                      pvVar4 = pBVar16[iVar10].shape.data;
                                      pAVar5 = pBVar16[iVar10].shape.allocator;
                                      if (pAVar5 == (Allocator *)0x0) {
                                        if (pvVar4 != (void *)0x0) {
                                          free(pvVar4);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar5 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar16[iVar10].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar10].shape.elemsize + 4) = 0;
                                  pBVar16[iVar10].shape.data = (void *)0x0;
                                  pBVar16[iVar10].shape.refcount = (int *)0x0;
                                  pBVar16[iVar10].shape.dims = 0;
                                  pBVar16[iVar10].shape.w = 0;
                                  pBVar16[iVar10].shape.h = 0;
                                  pBVar16[iVar10].shape.c = 0;
                                  pBVar16[iVar10].shape.cstep = 0;
                                  pBVar16[iVar10].shape.data = local_cc8.data;
                                  pBVar16[iVar10].shape.refcount =
                                       (int *)CONCAT44(local_cc8.refcount._4_4_,
                                                       local_cc8.refcount._0_4_);
                                  pBVar16[iVar10].shape.elemsize =
                                       CONCAT44(local_cc8.elemsize._4_4_,
                                                (undefined4)local_cc8.elemsize);
                                  pBVar16[iVar10].shape.elempack = local_cc8.elempack;
                                  pBVar16[iVar10].shape.allocator = local_cc8.allocator;
                                  pBVar16[iVar10].shape.dims = local_cc8.dims;
                                  pBVar16[iVar10].shape.w = local_cc8.w;
                                  pBVar16[iVar10].shape.h = local_cc8.h;
                                  pBVar16[iVar10].shape.c = local_cc8.c;
                                  pBVar16[iVar10].shape.cstep = local_cc8.cstep;
                                  iVar11 = local_cc8.dims;
                                }
                                local_cc8.dims = iVar11;
                                piVar3 = (int *)CONCAT44(local_cc8.refcount._4_4_,
                                                         local_cc8.refcount._0_4_);
                                if (piVar3 != (int *)0x0) {
                                  LOCK();
                                  *piVar3 = *piVar3 + -1;
                                  UNLOCK();
                                  if (*piVar3 == 0) {
                                    if (local_cc8.allocator == (Allocator *)0x0) {
                                      if (local_cc8.data != (void *)0x0) {
                                        free(local_cc8.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_cc8.allocator + 0x18))();
                                    }
                                  }
                                }
                              }
                              else if (iVar11 == 2) {
                                local_cc8.w = piVar19[-1];
                                local_cc8.h = *piVar19;
                                local_cc8.data = (void *)0x0;
                                local_cc8.refcount._0_4_ = 0;
                                local_cc8.refcount._4_4_ = 0;
                                local_cc8.elemsize._0_4_ = 4;
                                local_cc8.elemsize._4_4_ = 0;
                                local_cc8.elempack = 1;
                                local_cc8.allocator = (Allocator *)0x0;
                                local_cc8.dims = 2;
                                iVar8 = local_cc8.dims;
                                local_cc8.dims = 2;
                                local_cc8.c = 1;
                                local_cc8.cstep = (size_t)(local_cc8.h * local_cc8.w);
                                if (&pBVar16[iVar10].shape != &local_cc8) {
                                  piVar3 = pBVar16[iVar10].shape.refcount;
                                  if (piVar3 != (int *)0x0) {
                                    LOCK();
                                    *piVar3 = *piVar3 + -1;
                                    UNLOCK();
                                    if (*piVar3 == 0) {
                                      pvVar4 = pBVar16[iVar10].shape.data;
                                      pAVar5 = pBVar16[iVar10].shape.allocator;
                                      if (pAVar5 == (Allocator *)0x0) {
                                        if (pvVar4 != (void *)0x0) {
                                          free(pvVar4);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar5 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar16[iVar10].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar10].shape.elemsize + 4) = 0;
                                  pBVar16[iVar10].shape.data = (void *)0x0;
                                  pBVar16[iVar10].shape.refcount = (int *)0x0;
                                  pBVar16[iVar10].shape.dims = 0;
                                  pBVar16[iVar10].shape.w = 0;
                                  pBVar16[iVar10].shape.h = 0;
                                  pBVar16[iVar10].shape.c = 0;
                                  pBVar16[iVar10].shape.cstep = 0;
                                  pBVar16[iVar10].shape.data = local_cc8.data;
                                  pBVar16[iVar10].shape.refcount =
                                       (int *)CONCAT44(local_cc8.refcount._4_4_,
                                                       local_cc8.refcount._0_4_);
                                  pBVar16[iVar10].shape.elemsize =
                                       CONCAT44(local_cc8.elemsize._4_4_,
                                                (undefined4)local_cc8.elemsize);
                                  pBVar16[iVar10].shape.elempack = local_cc8.elempack;
                                  pBVar16[iVar10].shape.allocator = local_cc8.allocator;
                                  pBVar16[iVar10].shape.dims = local_cc8.dims;
                                  pBVar16[iVar10].shape.w = local_cc8.w;
                                  pBVar16[iVar10].shape.h = local_cc8.h;
                                  pBVar16[iVar10].shape.c = local_cc8.c;
                                  pBVar16[iVar10].shape.cstep = local_cc8.cstep;
                                  iVar8 = local_cc8.dims;
                                }
                                local_cc8.dims = iVar8;
                                piVar3 = (int *)CONCAT44(local_cc8.refcount._4_4_,
                                                         local_cc8.refcount._0_4_);
                                if (piVar3 != (int *)0x0) {
                                  LOCK();
                                  *piVar3 = *piVar3 + -1;
                                  UNLOCK();
                                  if (*piVar3 == 0) {
                                    if (local_cc8.allocator == (Allocator *)0x0) {
                                      if (local_cc8.data != (void *)0x0) {
                                        free(local_cc8.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_cc8.allocator + 0x18))();
                                    }
                                  }
                                }
LAB_0011da9f:
                                if (iVar11 == 3) goto LAB_0011daa9;
                              }
                              else if (iVar11 == 1) {
                                local_cc8.w = piVar19[-1];
                                local_cc8.cstep = (size_t)local_cc8.w;
                                local_cc8.data = (void *)0x0;
                                local_cc8.refcount._0_4_ = 0;
                                local_cc8.refcount._4_4_ = 0;
                                local_cc8.elemsize._0_4_ = 4;
                                local_cc8.elemsize._4_4_ = 0;
                                local_cc8.elempack = 1;
                                local_cc8.allocator = (Allocator *)0x0;
                                local_cc8.dims = 1;
                                iVar8 = local_cc8.dims;
                                local_cc8.dims = 1;
                                local_cc8.h = 1;
                                local_cc8.c = 1;
                                if (&pBVar16[iVar10].shape != &local_cc8) {
                                  piVar3 = pBVar16[iVar10].shape.refcount;
                                  if (piVar3 != (int *)0x0) {
                                    LOCK();
                                    *piVar3 = *piVar3 + -1;
                                    UNLOCK();
                                    if (*piVar3 == 0) {
                                      pvVar4 = pBVar16[iVar10].shape.data;
                                      pAVar5 = pBVar16[iVar10].shape.allocator;
                                      if (pAVar5 == (Allocator *)0x0) {
                                        if (pvVar4 != (void *)0x0) {
                                          free(pvVar4);
                                        }
                                      }
                                      else {
                                        (**(code **)(*(long *)pAVar5 + 0x18))();
                                      }
                                    }
                                  }
                                  *(undefined8 *)((long)&pBVar16[iVar10].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar16[iVar10].shape.elemsize + 4) = 0;
                                  pBVar16[iVar10].shape.data = (void *)0x0;
                                  pBVar16[iVar10].shape.refcount = (int *)0x0;
                                  pBVar16[iVar10].shape.dims = 0;
                                  pBVar16[iVar10].shape.w = 0;
                                  pBVar16[iVar10].shape.h = 0;
                                  pBVar16[iVar10].shape.c = 0;
                                  pBVar16[iVar10].shape.cstep = 0;
                                  pBVar16[iVar10].shape.data = local_cc8.data;
                                  pBVar16[iVar10].shape.refcount =
                                       (int *)CONCAT44(local_cc8.refcount._4_4_,
                                                       local_cc8.refcount._0_4_);
                                  pBVar16[iVar10].shape.elemsize =
                                       CONCAT44(local_cc8.elemsize._4_4_,
                                                (undefined4)local_cc8.elemsize);
                                  pBVar16[iVar10].shape.elempack = local_cc8.elempack;
                                  pBVar16[iVar10].shape.allocator = local_cc8.allocator;
                                  pBVar16[iVar10].shape.dims = local_cc8.dims;
                                  pBVar16[iVar10].shape.w = local_cc8.w;
                                  pBVar16[iVar10].shape.h = local_cc8.h;
                                  pBVar16[iVar10].shape.c = local_cc8.c;
                                  pBVar16[iVar10].shape.cstep = local_cc8.cstep;
                                  iVar8 = local_cc8.dims;
                                }
                                local_cc8.dims = iVar8;
                                piVar3 = (int *)CONCAT44(local_cc8.refcount._4_4_,
                                                         local_cc8.refcount._0_4_);
                                if (piVar3 != (int *)0x0) {
                                  LOCK();
                                  *piVar3 = *piVar3 + -1;
                                  UNLOCK();
                                  if (*piVar3 == 0) {
                                    if (local_cc8.allocator == (Allocator *)0x0) {
                                      if (local_cc8.data != (void *)0x0) {
                                        free(local_cc8.data);
                                      }
                                    }
                                    else {
                                      (**(code **)(*(long *)local_cc8.allocator + 0x18))();
                                    }
                                  }
                                }
                                goto LAB_0011da9f;
                              }
                              lVar18 = lVar18 + 1;
                              piVar19 = piVar19 + 4;
                            } while (lVar18 < local_cd4);
                          }
                          local_cc8.elempack = 0;
                          local_cc8.elemsize._4_4_ = 0;
                          local_cc8.elemsize._0_4_ = 0;
                          local_cc8.refcount._4_4_ = 0;
                          local_cc8.refcount._0_4_ = 0;
                          local_cc8.cstep = 0;
                          local_cc8.h = 0;
                          local_cc8.c = 0;
                          local_cc8.dims = 0;
                          local_cc8.w = 0;
                          local_cc8.data = (size_t *)0x0;
                          pvVar1 = &local_c78->bottom_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_cd0);
                          if (0 < local_cd0) {
                            lVar20 = 0;
                            lVar18 = 0;
                            do {
                              iVar10 = (local_c48->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar18];
                              pBVar16 = (local_c70->
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pMVar6 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar6->data + lVar20);
                              if ((Mat *)puVar2 != &pBVar16[iVar10].shape) {
                                piVar19 = pBVar16[iVar10].shape.refcount;
                                if (piVar19 != (int *)0x0) {
                                  LOCK();
                                  *piVar19 = *piVar19 + 1;
                                  UNLOCK();
                                }
                                piVar19 = *(int **)((long)&pMVar6->refcount + lVar20);
                                if (piVar19 != (int *)0x0) {
                                  LOCK();
                                  *piVar19 = *piVar19 + -1;
                                  UNLOCK();
                                  if (*piVar19 == 0) {
                                    pvVar4 = *(void **)((long)&pMVar6->data + lVar20);
                                    plVar7 = *(long **)((long)&pMVar6->allocator + lVar20);
                                    if (plVar7 == (long *)0x0) {
                                      if (pvVar4 != (void *)0x0) {
                                        free(pvVar4);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar7 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar6->dims + lVar20);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined8 *)((long)&pMVar6->cstep + lVar20) = 0;
                                piVar19 = pBVar16[iVar10].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar6->data + lVar20);
                                *puVar2 = pBVar16[iVar10].shape.data;
                                puVar2[1] = piVar19;
                                *(size_t *)((long)&pMVar6->elemsize + lVar20) =
                                     pBVar16[iVar10].shape.elemsize;
                                *(int *)((long)&pMVar6->elempack + lVar20) =
                                     pBVar16[iVar10].shape.elempack;
                                *(Allocator **)((long)&pMVar6->allocator + lVar20) =
                                     pBVar16[iVar10].shape.allocator;
                                iVar11 = pBVar16[iVar10].shape.w;
                                iVar8 = pBVar16[iVar10].shape.h;
                                iVar9 = pBVar16[iVar10].shape.c;
                                piVar19 = (int *)((long)&pMVar6->dims + lVar20);
                                *piVar19 = pBVar16[iVar10].shape.dims;
                                piVar19[1] = iVar11;
                                piVar19[2] = iVar8;
                                piVar19[3] = iVar9;
                                *(size_t *)((long)&pMVar6->cstep + lVar20) =
                                     pBVar16[iVar10].shape.cstep;
                              }
                              lVar18 = lVar18 + 1;
                              lVar20 = lVar20 + 0x40;
                            } while (lVar18 < local_cd0);
                          }
                          pvVar1 = &local_c78->top_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_cd4);
                          if (0 < local_cd4) {
                            lVar18 = 0;
                            lVar20 = 0;
                            do {
                              iVar10 = (local_c58->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar20];
                              pBVar16 = (local_c70->
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pMVar6 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar6->data + lVar18);
                              if ((Mat *)puVar2 != &pBVar16[iVar10].shape) {
                                piVar19 = pBVar16[iVar10].shape.refcount;
                                if (piVar19 != (int *)0x0) {
                                  LOCK();
                                  *piVar19 = *piVar19 + 1;
                                  UNLOCK();
                                }
                                piVar19 = *(int **)((long)&pMVar6->refcount + lVar18);
                                if (piVar19 != (int *)0x0) {
                                  LOCK();
                                  *piVar19 = *piVar19 + -1;
                                  UNLOCK();
                                  if (*piVar19 == 0) {
                                    pvVar4 = *(void **)((long)&pMVar6->data + lVar18);
                                    plVar7 = *(long **)((long)&pMVar6->allocator + lVar18);
                                    if (plVar7 == (long *)0x0) {
                                      if (pvVar4 != (void *)0x0) {
                                        free(pvVar4);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar7 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar6->dims + lVar18);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined8 *)((long)&pMVar6->cstep + lVar18) = 0;
                                piVar19 = pBVar16[iVar10].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar6->data + lVar18);
                                *puVar2 = pBVar16[iVar10].shape.data;
                                puVar2[1] = piVar19;
                                *(size_t *)((long)&pMVar6->elemsize + lVar18) =
                                     pBVar16[iVar10].shape.elemsize;
                                *(int *)((long)&pMVar6->elempack + lVar18) =
                                     pBVar16[iVar10].shape.elempack;
                                *(Allocator **)((long)&pMVar6->allocator + lVar18) =
                                     pBVar16[iVar10].shape.allocator;
                                iVar11 = pBVar16[iVar10].shape.w;
                                iVar8 = pBVar16[iVar10].shape.h;
                                iVar9 = pBVar16[iVar10].shape.c;
                                piVar19 = (int *)((long)&pMVar6->dims + lVar18);
                                *piVar19 = pBVar16[iVar10].shape.dims;
                                piVar19[1] = iVar11;
                                piVar19[2] = iVar8;
                                piVar19[3] = iVar9;
                                *(size_t *)((long)&pMVar6->cstep + lVar18) =
                                     pBVar16[iVar10].shape.cstep;
                              }
                              lVar20 = lVar20 + 1;
                              lVar18 = lVar18 + 0x40;
                            } while (lVar20 < local_cd4);
                          }
                          pLVar13 = local_c78;
                          iVar10 = (*local_c78->_vptr_Layer[2])(local_c78,&local_930);
                          dr = local_c68;
                          if (iVar10 == 0) {
                            (local_c40->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[local_ccc] = pLVar13;
                          }
                          else {
                            load_param();
                          }
                          uVar12 = 0;
                          piVar19 = (int *)CONCAT44(local_c38[0].refcount._4_4_,
                                                    local_c38[0].refcount._0_4_);
                          if (piVar19 != (int *)0x0) {
                            LOCK();
                            *piVar19 = *piVar19 + -1;
                            UNLOCK();
                            if (*piVar19 == 0) {
                              if (local_c38[0].allocator == (Allocator *)0x0) {
                                if ((size_t *)local_c38[0].data != (size_t *)0x0) {
                                  free(local_c38[0].data);
                                }
                              }
                              else {
                                (**(code **)(*(long *)local_c38[0].allocator + 0x18))();
                              }
                            }
                          }
                          local_c38[0].elemsize._0_4_ = 0;
                          local_c38[0].elemsize._4_4_ = 0;
                          local_c38[0].elempack = 0;
                          local_c38[0].data = (size_t *)0x0;
                          local_c38[0].refcount._0_4_ = 0;
                          local_c38[0].refcount._4_4_ = 0;
                          local_c38[0].dims = 0;
                          local_c38[0].w = 0;
                          local_c38[0].h = 0;
                          local_c38[0].c = 0;
                          local_c38[0].cstep = 0;
                        }
                        else {
                          load_param();
                          uVar12 = 0;
                        }
                      }
                    }
                  }
                }
                else {
                  load_param();
LAB_0011d773:
                  uVar12 = 1;
                }
                if ((uVar12 & 0xb) != 0) break;
                local_ccc = local_ccc + 1;
                local_cd5 = local_ccc < local_c7c;
              } while (local_ccc < local_c7c);
            }
            lVar18 = 0x8c0;
            do {
              piVar19 = *(int **)((long)&local_930.params[0].v.data + lVar18);
              if (piVar19 != (int *)0x0) {
                LOCK();
                *piVar19 = *piVar19 + -1;
                UNLOCK();
                if (*piVar19 == 0) {
                  pvVar4 = *(void **)((long)&local_930.params[0].type + lVar18);
                  plVar7 = *(long **)((long)&local_930.params[0].v.elempack + lVar18);
                  if (plVar7 == (long *)0x0) {
                    if (pvVar4 != (void *)0x0) {
                      free(pvVar4);
                    }
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar18 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar18 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar18) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar18) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar18) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar18) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar18) = 0;
              lVar18 = lVar18 + -0x48;
            } while (lVar18 != -0x40);
            return -(uint)local_cd5;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v) \
    if (dr.scan(fmt, &v) != 1) \
    { \
        fprintf(stderr, "parse " #v " failed\n"); \
        return -1; \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize((size_t)layer_count);
    blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i=0; i<layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %s not exists or registered\n", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d %s\n", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j=0; j<bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
//                 fprintf(stderr, "new blob %s\n", bottom_name);

                blob_index++;
            }

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            Blob& blob = blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef SCAN_VALUE
    return 0;
}